

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<float>::ContributeTestV1
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *testV1,int NumCoarse)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  ulong col_00;
  ulong sRow;
  long col_01;
  float local_1e4;
  TPZFMatrix<float> temp2;
  TPZFMatrix<float> col;
  TPZFMatrix<float> temp1;
  
  TPZFMatrix<float>::TPZFMatrix(&temp1,(long)this->fNEquations,(this->fCoarseIndex).fNElements);
  for (lVar5 = 0; lVar5 < (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
      lVar5 = lVar5 + 1) {
    for (col_01 = 0; col_01 < (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol;
        col_01 = col_01 + 1) {
      pfVar3 = TPZFMatrix<float>::operator()(&this->fPhiC,lVar5,col_01);
      fVar1 = *pfVar3;
      fVar2 = (this->fWeights).super_TPZVec<float>.fStore[lVar5];
      pfVar3 = TPZFMatrix<float>::operator()(&temp1,lVar5,col_01);
      *pfVar3 = fVar1 * fVar2;
    }
  }
  TPZFMatrix<float>::TPZFMatrix(&col,(long)this->fNEquations,1);
  local_1e4 = 0.0;
  TPZFMatrix<float>::TPZFMatrix(&temp2,(long)this->fNEquations,(long)NumCoarse,&local_1e4);
  for (lVar5 = 0; lVar5 < (this->fCoarseIndex).fNElements; lVar5 = lVar5 + 1) {
    TPZMatrix<float>::GetSub
              (&temp1.super_TPZMatrix<float>,0,lVar5,
               temp1.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow,1,&col);
    TPZMatrix<float>::PutSub
              (&temp2.super_TPZMatrix<float>,0,(long)(this->fCoarseIndex).fStore[lVar5],&col);
  }
  TPZFMatrix<float>::Resize(&col,1,(long)NumCoarse);
  sRow = 0;
  uVar4 = (ulong)(uint)NumCoarse;
  if (NumCoarse < 1) {
    uVar4 = sRow;
  }
  for (; (long)sRow < (long)this->fNEquations; sRow = sRow + 1) {
    TPZMatrix<float>::GetSub
              (&temp2.super_TPZMatrix<float>,sRow,0,1,
               temp2.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol,&col);
    for (col_00 = 0; uVar4 != col_00; col_00 = col_00 + 1) {
      pfVar3 = TPZFMatrix<float>::operator()(&col,0,col_00);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()(testV1,(long)(this->fGlobalIndex).fStore[sRow],col_00);
      *pfVar3 = fVar1 + *pfVar3;
    }
  }
  TPZFMatrix<float>::~TPZFMatrix(&temp2);
  TPZFMatrix<float>::~TPZFMatrix(&col);
  TPZFMatrix<float>::~TPZFMatrix(&temp1);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeTestV1(TPZFMatrix<TVar> &testV1, int NumCoarse) {
	/* temp1 will be equal to W(i)*Phi(i) */
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	int i,j;
	for(i=0;i<fPhiC.Rows();i++) {
		for(j=0;j<fPhiC.Cols();j++) {
			temp1(i,j) = fPhiC(i,j)*fWeights[i];
		}
	}
	/* And now temp2 will be equal to temp1*R(ci) */
	TPZFMatrix<TVar> col(fNEquations,1);
	TPZFMatrix<TVar> temp2(fNEquations,NumCoarse,0.);
	for(i=0;i<fCoarseIndex.NElements();i++) {
		temp1.GetSub(0,i,temp1.Rows(),1,col);
		temp2.PutSub(0,fCoarseIndex[i],col);
	}
	/* And testV1 will be equal to R(i)_trans*temp2 */
	col.Resize(1,NumCoarse);
	for(i=0;i<fNEquations;i++) {
		temp2.GetSub(i,0,1,temp2.Cols(),col);
		//testV1.PutSub(fGlobalIndex[i],0,col);
		for(j=0;j<NumCoarse;j++) {
			testV1(fGlobalIndex[i],j) += col(0,j);
		}
	}
}